

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intgemm.cc
# Opt level: O0

CPUType intgemm::GetCPUID(void)

{
  int iVar1;
  CPUType *pCVar2;
  CPUType local_18 [5];
  CPUType local_4;
  
  if (GetCPUID()::kLocalCPU == '\0') {
    iVar1 = __cxa_guard_acquire(&GetCPUID()::kLocalCPU);
    if (iVar1 != 0) {
      local_4 = anon_unknown_15::RealCPUID();
      local_18[0] = anon_unknown_15::EnvironmentCPUID();
      pCVar2 = std::min<intgemm::CPUType>(&local_4,local_18);
      GetCPUID::kLocalCPU = *pCVar2;
      __cxa_guard_release(&GetCPUID()::kLocalCPU);
    }
  }
  return GetCPUID::kLocalCPU;
}

Assistant:

CPUType GetCPUID() {
  static const CPUType kLocalCPU =
#ifdef INTGEMM_CPUID_ENVIRONMENT
    std::min(RealCPUID(), EnvironmentCPUID());
#else
    RealCPUID();
#endif
  return kLocalCPU;
}